

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::any::holder<cs::numeric>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,holder<cs::numeric> *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint __len;
  ulong __val;
  longdouble lVar5;
  stringstream ss;
  char *local_1c8;
  size_type local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined8 uStack_1b0;
  stringstream local_1a8 [16];
  long local_198;
  long alStack_190 [13];
  ios_base local_128 [264];
  
  if ((this->mDat).type == false) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    local_1c0 = 0;
    local_1b8 = '\0';
    *(long *)((long)alStack_190 + *(long *)(local_198 + -0x18)) =
         (long)*(int *)(cs::current_process + 0x50);
    lVar5 = *(longdouble *)&(this->mDat).data;
    if ((this->mDat).type != false) {
      lVar5 = (longdouble)(this->mDat).data._int;
    }
    local_1c8 = &local_1b8;
    std::ostream::_M_insert<long_double>(lVar5);
    std::operator>>((istream *)local_1a8,(string *)&local_1c8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_1c8 == &local_1b8) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1b7,local_1b8);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1b0;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_1c8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_1b7,local_1b8);
    }
    __return_storage_ptr__->_M_string_length = local_1c0;
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  else {
    uVar1 = *(ulong *)&(this->mDat).data;
    __val = -uVar1;
    if (0 < (long)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar4 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_001235a1;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_001235a1;
        }
        if (uVar4 < 10000) goto LAB_001235a1;
        bVar2 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_001235a1:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar1 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar1 >> 0x3f),__len,__val);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}